

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O3

bool Diligent::VerifyResourceBinding<Diligent::SamplerVkImpl>
               (char *ExpectedResourceTypeName,PipelineResourceDesc *ResDesc,
               BindResourceInfo *BindInfo,SamplerVkImpl *pResourceImpl,IDeviceObject *pCachedObject,
               char *SignatureName)

{
  Char *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  ostream *poVar4;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_00;
  char *pcVar6;
  undefined1 *puVar7;
  Uint32 ArrayIndex;
  string msg;
  stringstream ss;
  String local_200;
  Diligent local_1e0;
  undefined7 uStack_1df;
  long local_1d0 [2];
  Char *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  ArrayIndex = (Uint32)pCachedObject;
  if ((pResourceImpl == (SamplerVkImpl *)0x0) && (BindInfo->pObject != (IDeviceObject *)0x0)) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Failed to bind object \'",0x17);
    iVar2 = (*(BindInfo->pObject->super_IObject)._vptr_IObject[4])();
    pcVar6 = *(char **)CONCAT44(extraout_var,iVar2);
    iVar2 = (int)(ostream *)local_1a8;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\' to variable \'",0xf)
    ;
    GetShaderResourcePrintName_abi_cxx11_
              (&local_200,(Diligent *)ResDesc->Name,(char *)(ulong)ResDesc->ArraySize,
               BindInfo->ArrayIndex,ArrayIndex);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,
                        (char *)CONCAT71(local_200._M_dataplus._M_p._1_7_,
                                         local_200._M_dataplus._M_p._0_1_),
                        local_200._M_string_length);
    local_1e0 = (Diligent)0x27;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_1e0,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_) !=
        &local_200.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_),
                      local_200.field_2._M_allocated_capacity + 1);
    }
    if (SignatureName != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," defined by signature \'",0x17);
      sVar3 = strlen(SignatureName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,SignatureName,sVar3);
      local_200._M_dataplus._M_p._0_1_ = 0x27;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_200,1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,". Invalid resource type: ",0x19);
    if (ExpectedResourceTypeName == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar3 = strlen(ExpectedResourceTypeName);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,ExpectedResourceTypeName,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," is expected.",0xd);
    std::__cxx11::stringbuf::str();
    FormatString<std::__cxx11::string>(&local_200,&local_1e0,Args);
    if ((long *)CONCAT71(uStack_1df,local_1e0) != local_1d0) {
      operator_delete((long *)CONCAT71(uStack_1df,local_1e0),local_1d0[0] + 1);
    }
    DebugAssertionFailed
              ((Char *)CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_),
               "VerifyResourceBinding",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0xb1);
    puVar7 = (undefined1 *)
             CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7 == &local_200.field_2) goto LAB_00238fb1;
  }
  else {
    if (ResDesc->VarType == SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC) {
      return true;
    }
    if ((SamplerVkImpl *)pCachedObject == pResourceImpl) {
      return true;
    }
    if (pCachedObject == (IDeviceObject *)0x0) {
      return true;
    }
    if ((BindInfo->Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) !=
        SET_SHADER_RESOURCE_FLAG_NONE) {
      return true;
    }
    local_1c0 = GetShaderVariableTypeLiteralName(ResDesc->VarType,false);
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Non-null ",9);
    if (ExpectedResourceTypeName == (char *)0x0) {
      std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar3 = strlen(ExpectedResourceTypeName);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,ExpectedResourceTypeName,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," \'",2);
    iVar2 = (*(pCachedObject->super_IObject)._vptr_IObject[4])(pCachedObject);
    pcVar6 = *(char **)CONCAT44(extraout_var_00,iVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\' is already bound to ",0x16);
    pCVar1 = local_1c0;
    if (local_1c0 == (char *)0x0) {
      std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar3 = strlen(local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pCVar1,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," shader variable \'",0x12);
    GetShaderResourcePrintName_abi_cxx11_
              (&local_200,(Diligent *)ResDesc->Name,(char *)(ulong)ResDesc->ArraySize,
               BindInfo->ArrayIndex,ArrayIndex);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,
                        (char *)CONCAT71(local_200._M_dataplus._M_p._1_7_,
                                         local_200._M_dataplus._M_p._0_1_),
                        local_200._M_string_length);
    local_1e0 = (Diligent)0x27;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_1e0,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_) !=
        &local_200.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_),
                      local_200.field_2._M_allocated_capacity + 1);
    }
    if (SignatureName != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," defined by signature \'",0x17);
      sVar3 = strlen(SignatureName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,SignatureName,sVar3);
      local_200._M_dataplus._M_p._0_1_ = 0x27;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_200,1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,". Overwriting the binding with ",0x1f);
    if (pResourceImpl == (SamplerVkImpl *)0x0) {
      lVar5 = 4;
      pcVar6 = "null";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"another resource (\'",0x13);
      pcVar6 = (pResourceImpl->super_SamplerBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::ISamplerVk,_Diligent::RenderDeviceVkImpl,_Diligent::SamplerDesc>
               .m_Desc.super_DeviceObjectAttribs.Name;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar3);
      }
      lVar5 = 2;
      pcVar6 = "\')";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," is disallowed by default.",0x1a);
    if (ResDesc->VarType == SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 " If this is intended and you ensured proper synchronization, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. Otherwise,"
                 ,0x7e);
      lVar5 = 0x4f;
      pcVar6 = " use another shader resource binding instance or label the variable as dynamic.";
LAB_0023927c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar5);
    }
    else if (ResDesc->VarType == SHADER_RESOURCE_VARIABLE_TYPE_STATIC) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 " If this is intended, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. Otherwise,"
                 ,0x57);
      lVar5 = 0x72;
      pcVar6 = 
      " label the variable as mutable and use another shader resource binding instance, or label the variable as dynamic."
      ;
      goto LAB_0023927c;
    }
    std::__cxx11::stringbuf::str();
    FormatString<std::__cxx11::string>(&local_200,&local_1e0,Args_00);
    if ((long *)CONCAT71(uStack_1df,local_1e0) != local_1d0) {
      operator_delete((long *)CONCAT71(uStack_1df,local_1e0),local_1d0[0] + 1);
    }
    DebugAssertionFailed
              ((Char *)CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_),
               "VerifyResourceBinding",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0xd9);
    puVar7 = (undefined1 *)
             CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7 == &local_200.field_2) goto LAB_00238fb1;
  }
  operator_delete(puVar7,local_200.field_2._M_allocated_capacity + 1);
LAB_00238fb1:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool VerifyResourceBinding(const char*                 ExpectedResourceTypeName,
                           const PipelineResourceDesc& ResDesc,
                           const BindResourceInfo&     BindInfo,
                           const ResourceImplType*     pResourceImpl, // Expected resource implementation
                           const IDeviceObject*        pCachedObject, // Object already set in the cache
                           const char*                 SignatureName)
{
    if (BindInfo.pObject != nullptr && pResourceImpl == nullptr)
    {
        std::stringstream ss;
        ss << "Failed to bind object '" << BindInfo.pObject->GetDesc().Name << "' to variable '" << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
        if (SignatureName != nullptr)
        {
            ss << " defined by signature '" << SignatureName << '\'';
        }
        ss << ". Invalid resource type: " << ExpectedResourceTypeName << " is expected.";
        RESOURCE_VALIDATION_FAILURE(ss.str());

        return false;
    }

    if (ResDesc.VarType != SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC &&
        (BindInfo.Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) == 0 &&
        pCachedObject != nullptr && pCachedObject != pResourceImpl)
    {
        const char* VarTypeStr = GetShaderVariableTypeLiteralName(ResDesc.VarType);

        std::stringstream ss;
        ss << "Non-null " << ExpectedResourceTypeName << " '" << pCachedObject->GetDesc().Name << "' is already bound to " << VarTypeStr
           << " shader variable '" << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
        if (SignatureName != nullptr)
        {
            ss << " defined by signature '" << SignatureName << '\'';
        }
        ss << ". Overwriting the binding with ";
        if (pResourceImpl != nullptr)
        {
            ss << "another resource ('" << pResourceImpl->GetDesc().Name << "')";
        }
        else
        {
            ss << "null";
        }
        ss << " is disallowed by default.";

        if (ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_STATIC)
        {
            ss << " If this is intended, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. Otherwise,"
               << " label the variable as mutable and use another shader resource binding instance, or label the variable as dynamic.";
        }
        else if (ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE)
        {
            ss << " If this is intended and you ensured proper synchronization, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. Otherwise,"
               << " use another shader resource binding instance or label the variable as dynamic.";
        }

        RESOURCE_VALIDATION_FAILURE(ss.str());

        return false;
    }

    return true;
}